

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

void __thiscall leveldb::Block::Iter::Seek(Iter *this,Slice *target)

{
  byte *limit;
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  byte *p;
  byte *p_00;
  uint uVar6;
  uint uVar7;
  uint index;
  uint32_t value_length;
  uint32_t non_shared;
  uint32_t shared;
  Slice mid_key;
  uint local_4c;
  uint local_48;
  uint local_44;
  byte *local_40;
  ulong local_38;
  
  index = 0;
  uVar7 = this->num_restarts_ - 1;
  if (uVar7 != 0) {
    do {
      uVar6 = index + uVar7 + 1 >> 1;
      if (this->num_restarts_ <= uVar6) {
        __assert_fail("index < num_restarts_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/block.cc"
                      ,0x65,"uint32_t leveldb::Block::Iter::GetRestartPoint(uint32_t)");
      }
      uVar1 = this->restarts_;
      limit = (byte *)(this->data_ + uVar1);
      uVar2 = *(uint *)(limit + (ulong)uVar6 * 4);
      if ((long)((ulong)uVar1 - (ulong)uVar2) < 3) {
LAB_001241a6:
        CorruptionError(this);
        return;
      }
      pbVar5 = (byte *)(this->data_ + uVar2);
      local_44 = (uint)*pbVar5;
      local_48 = (uint)pbVar5[1];
      local_4c = (uint)pbVar5[2];
      if ((byte)(pbVar5[1] | *pbVar5 | pbVar5[2]) < 0x80) {
        pbVar5 = pbVar5 + 3;
      }
      else {
        if ((uVar2 < uVar1) && (-1 < (char)*pbVar5)) {
          p = pbVar5 + 1;
          local_44 = (int)(char)*pbVar5;
        }
        else {
          p = (byte *)GetVarint32PtrFallback((char *)pbVar5,(char *)limit,&local_44);
          if (p == (byte *)0x0) goto LAB_001241a6;
        }
        if ((p < limit) && (-1 < (char)*p)) {
          p_00 = p + 1;
          local_48 = (int)(char)*p;
        }
        else {
          p_00 = (byte *)GetVarint32PtrFallback((char *)p,(char *)limit,&local_48);
          if (p_00 == (byte *)0x0) goto LAB_001241a6;
        }
        if ((p_00 < limit) && (-1 < (char)*p_00)) {
          pbVar5 = p_00 + 1;
          local_4c = (int)(char)*p_00;
        }
        else {
          pbVar5 = (byte *)GetVarint32PtrFallback((char *)p_00,(char *)limit,&local_4c);
          if (pbVar5 == (byte *)0x0) goto LAB_001241a6;
        }
      }
      if (((uint)((int)limit - (int)pbVar5) < local_4c + local_48) || (local_44 != 0))
      goto LAB_001241a6;
      local_40 = pbVar5;
      local_38 = (ulong)local_48;
      iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,target);
      uVar1 = uVar6 - 1;
      if (iVar4 < 0) {
        index = uVar6;
        uVar1 = uVar7;
      }
      uVar7 = uVar1;
    } while (index < uVar7);
  }
  SeekToRestartPoint(this,index);
  do {
    bVar3 = ParseNextKey(this);
    if (!bVar3) {
      return;
    }
    local_40 = (byte *)(this->key_)._M_dataplus._M_p;
    local_38 = (this->key_)._M_string_length;
    iVar4 = (*this->comparator_->_vptr_Comparator[2])(this->comparator_,&local_40,target);
  } while (iVar4 < 0);
  return;
}

Assistant:

void Seek(const Slice& target) override {
    // Binary search in restart array to find the last restart point
    // with a key < target
    uint32_t left = 0;
    uint32_t right = num_restarts_ - 1;
    while (left < right) {
      uint32_t mid = (left + right + 1) / 2;
      uint32_t region_offset = GetRestartPoint(mid);
      uint32_t shared, non_shared, value_length;
      const char* key_ptr =
          DecodeEntry(data_ + region_offset, data_ + restarts_, &shared,
                      &non_shared, &value_length);
      if (key_ptr == nullptr || (shared != 0)) {
        CorruptionError();
        return;
      }
      Slice mid_key(key_ptr, non_shared);
      if (Compare(mid_key, target) < 0) {
        // Key at "mid" is smaller than "target".  Therefore all
        // blocks before "mid" are uninteresting.
        left = mid;
      } else {
        // Key at "mid" is >= "target".  Therefore all blocks at or
        // after "mid" are uninteresting.
        right = mid - 1;
      }
    }

    // Linear search (within restart block) for first key >= target
    SeekToRestartPoint(left);
    while (true) {
      if (!ParseNextKey()) {
        return;
      }
      if (Compare(key_, target) >= 0) {
        return;
      }
    }
  }